

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O3

DNA * __thiscall Population::GetDNAWithProbability(Population *this,double probability)

{
  DNA *pDVar1;
  DNA *dna;
  DNA *pDVar2;
  double dVar3;
  
  pDVar2 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar1 = (this->population_).super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar2 != pDVar1) {
    dVar3 = 0.0;
    do {
      dVar3 = dVar3 + pDVar2->fitness;
      if (probability < dVar3) {
        return pDVar2;
      }
      pDVar2 = pDVar2 + 1;
    } while (pDVar2 != pDVar1);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vocheretnyi[P]genetic-schedule/Population.cpp"
                ,0x9c,"const DNA &Population::GetDNAWithProbability(double) const");
}

Assistant:

const DNA& Population::GetDNAWithProbability(double probability) const {
    double sum = 0.0f;
    for (const DNA& dna : population_) {
        sum += dna.fitness;
        if (probability < sum) {
            return dna;
        }
    }
    assert(false);
    return DNA();
}